

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ReadSocketData(ReadData *this,BUFF *buff,int desc)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  int iVar4;
  uchar tmp [1024];
  
  if (buff->pos == 0) {
    for (iVar4 = 0; iVar4 < 0x7698; iVar4 = iVar4 + (int)uVar1) {
      memset(tmp,0,0x400);
      uVar1 = recv(desc,tmp,0x400,0);
      uVar2 = uVar1 & 0xffffffff;
      if ((int)uVar1 < 1) {
        uVar2 = 0;
      }
      for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
        buff->buff[uVar1 + (long)iVar4] = tmp[uVar1];
      }
    }
    buff->len = iVar4;
    buff->pos = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = reset(this,buff);
    __cxa_begin_catch(iVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,"error happened when getting data from socket");
    std::endl<char,std::char_traits<char>>(poVar3);
    __cxa_end_catch();
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int ReadData::ReadSocketData(BUFF &buff, int desc) {
    // 将数据先读入缓冲区
    if(buff.pos != 0)
        reset(buff);
    int count = buff.pos;
    try
    {
        while (count < MAXDATALEN)
        {
            unsigned char tmp[1024];
            memset(tmp, 0x00, 1024);
            int num = recv(desc, tmp, 1024, 0);
            for(int i = 0; i < num; ++i)
                buff.buff[count++] = tmp[i];
            // buff[count] = tmp;
        }
        buff.len = count;
        buff.pos = 0;
        return 0;
    }
    catch(...)
    {
        cout << "error happened when getting data from socket" << endl;
        return UNKNOWN_ERROR;
    } 
}